

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common-test.c
# Opt level: O0

void test_enabled(void)

{
  int iVar1;
  int local_54;
  int rc;
  int en_short;
  int en_long;
  uint i;
  uint64_t msrval;
  raplcap_msr_ctx ctx;
  
  msr_get_context((raplcap_msr_ctx *)&msrval,0x3d,0xa0e03);
  en_short = 0;
  while( true ) {
    if (1 < (uint)en_short) {
      return;
    }
    rc = 1;
    local_54 = 1;
    iVar1 = msr_is_zone_enabled((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],0,&rc,
                                &local_54);
    if (rc != 0) {
      __assert_fail("en_long == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                    ,0xaf,"void test_enabled(void)");
    }
    if (TEST_ZONES_HAS_SHORT[(uint)en_short] == 0) {
      if (iVar1 != 1) {
        __assert_fail("rc == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xb4,"void test_enabled(void)");
      }
      if (local_54 == 0) {
        __assert_fail("en_short",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xb5,"void test_enabled(void)");
      }
    }
    else {
      if (iVar1 != 2) {
        __assert_fail("rc == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xb1,"void test_enabled(void)");
      }
      if (local_54 != 0) {
        __assert_fail("en_short == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xb2,"void test_enabled(void)");
      }
    }
    rc = 1;
    _en_long = msr_set_zone_enabled
                         ((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],0,&rc,(int *)0x0);
    if (_en_long != 0x8000) {
      __assert_fail("msrval == MSRVAL_ENABLED_LONG",
                    "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                    ,0xb9,"void test_enabled(void)");
    }
    rc = 0;
    local_54 = 0;
    msr_is_zone_enabled((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],0x8000,&rc,&local_54);
    if (rc == 0) break;
    if (local_54 != 0) {
      __assert_fail("en_short == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                    ,0xbe,"void test_enabled(void)");
    }
    local_54 = 1;
    _en_long = msr_set_zone_enabled
                         ((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],0,(int *)0x0,
                          &local_54);
    rc = 0;
    local_54 = 0;
    msr_is_zone_enabled((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],_en_long,&rc,&local_54
                       );
    if (rc != 0) {
      __assert_fail("!en_long",
                    "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                    ,0xc4,"void test_enabled(void)");
    }
    if (TEST_ZONES_HAS_SHORT[(uint)en_short] == 0) {
      if (_en_long != 0) {
        __assert_fail("msrval == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xc9,"void test_enabled(void)");
      }
      if (local_54 != 0) {
        __assert_fail("en_short == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xca,"void test_enabled(void)");
      }
    }
    else {
      if (_en_long != 0x800000000000) {
        __assert_fail("msrval == MSRVAL_ENABLED_SHORT",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xc6,"void test_enabled(void)");
      }
      if (local_54 == 0) {
        __assert_fail("en_short",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,199,"void test_enabled(void)");
      }
    }
    rc = 1;
    local_54 = 1;
    _en_long = msr_set_zone_enabled
                         ((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],0,&rc,&local_54);
    rc = 0;
    local_54 = 0;
    msr_is_zone_enabled((raplcap_msr_ctx *)&msrval,TEST_ZONES[(uint)en_short],_en_long,&rc,&local_54
                       );
    if (rc == 0) {
      __assert_fail("en_long",
                    "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                    ,0xd2,"void test_enabled(void)");
    }
    if (TEST_ZONES_HAS_SHORT[(uint)en_short] == 0) {
      if (_en_long != 0x8000) {
        __assert_fail("msrval == MSRVAL_ENABLED_LONG",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xd7,"void test_enabled(void)");
      }
      if (local_54 != 0) {
        __assert_fail("en_short == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xd8,"void test_enabled(void)");
      }
    }
    else {
      if (_en_long != 0x800000008000) {
        __assert_fail("msrval == MSRVAL_ENABLED_BOTH",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xd4,"void test_enabled(void)");
      }
      if (local_54 == 0) {
        __assert_fail("en_short",
                      "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                      ,0xd5,"void test_enabled(void)");
      }
    }
    en_short = en_short + 1;
  }
  __assert_fail("en_long",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/test/raplcap-msr-common-test.c"
                ,0xbd,"void test_enabled(void)");
}

Assistant:

static void test_enabled(void) {
  raplcap_msr_ctx ctx;
  uint64_t msrval;
  unsigned int i;
  int en_long;
  int en_short;
  int rc;
  msr_get_context(&ctx, TEST_CPU_MODEL, TEST_UNITS_MSRVAL);

  for (i = 0; i < TEST_ZONE_COUNT; i++) {
    en_long = 1;
    en_short = 1;
    rc = msr_is_zone_enabled(&ctx, TEST_ZONES[i], 0, &en_long, &en_short);
    assert(en_long == 0);
    if (TEST_ZONES_HAS_SHORT[i]) {
      assert(rc == 2);
      assert(en_short == 0);
    } else {
      assert(rc == 1);
      assert(en_short);
    }
    en_long = 1;
    msrval = msr_set_zone_enabled(&ctx, TEST_ZONES[i], 0, &en_long, NULL);
    assert(msrval == MSRVAL_ENABLED_LONG);
    en_long = 0;
    en_short = 0;
    msr_is_zone_enabled(&ctx, TEST_ZONES[i], msrval, &en_long, &en_short);
    assert(en_long);
    assert(en_short == 0);
    en_short = 1;
    msrval = msr_set_zone_enabled(&ctx, TEST_ZONES[i], 0, 0, &en_short);
    en_long = 0;
    en_short = 0;
    msr_is_zone_enabled(&ctx, TEST_ZONES[i], msrval, &en_long, &en_short);
    assert(!en_long);
    if (TEST_ZONES_HAS_SHORT[i]) {
      assert(msrval == MSRVAL_ENABLED_SHORT);
      assert(en_short);
    } else {
      assert(msrval == 0);
      assert(en_short == 0);
    }
    en_long = 1;
    en_short = 1;
    msrval = msr_set_zone_enabled(&ctx, TEST_ZONES[i], 0, &en_long, &en_short);
    en_long = 0;
    en_short = 0;
    msr_is_zone_enabled(&ctx, TEST_ZONES[i], msrval, &en_long, &en_short);
    assert(en_long);
    if (TEST_ZONES_HAS_SHORT[i]) {
      assert(msrval == MSRVAL_ENABLED_BOTH);
      assert(en_short);
    } else {
      assert(msrval == MSRVAL_ENABLED_LONG);
      assert(en_short == 0);
    }
  }
}